

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O0

RefNode * __thiscall
RefTable::Get(RefTable *this,SQObject *obj,SQHash *mainpos,RefNode **prev,bool add)

{
  SQHash SVar1;
  SQObjectPtr local_68 [2];
  SQObjectPtr local_48;
  RefNode *local_38;
  RefNode *ref;
  RefNode **ppRStack_28;
  bool add_local;
  RefNode **prev_local;
  SQHash *mainpos_local;
  SQObject *obj_local;
  RefTable *this_local;
  
  ref._7_1_ = add;
  ppRStack_28 = prev;
  prev_local = (RefNode **)mainpos;
  mainpos_local = (SQHash *)obj;
  obj_local = (SQObject *)this;
  ::SQObjectPtr::SQObjectPtr(&local_48,obj);
  SVar1 = HashObj(&local_48);
  *prev_local = (RefNode *)(SVar1 & this->_numofslots - 1);
  ::SQObjectPtr::~SQObjectPtr(&local_48);
  *ppRStack_28 = (RefNode *)0x0;
  local_38 = this->_buckets[(long)*prev_local];
  while ((local_38 != (RefNode *)0x0 &&
         (((local_38->obj).super_SQObject._unVal.pTable != (SQTable *)mainpos_local[1] ||
          ((local_38->obj).super_SQObject._type != (SQObjectType)*mainpos_local))))) {
    *ppRStack_28 = local_38;
    local_38 = local_38->next;
  }
  if ((local_38 == (RefNode *)0x0) && ((ref._7_1_ & 1) != 0)) {
    if (this->_numofslots == this->_slotused) {
      if (this->_freelist != (RefNode *)0x0) {
        __assert_fail("_freelist == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/DaZombieKiller[P]SqNET/squirrel/squirrel/sqstate.cpp"
                      ,0x206,
                      "RefTable::RefNode *RefTable::Get(SQObject &, SQHash &, RefNode **, bool)");
      }
      Resize(this,this->_numofslots * 2);
      ::SQObjectPtr::SQObjectPtr(local_68,(SQObject *)mainpos_local);
      SVar1 = HashObj(local_68);
      *prev_local = (RefNode *)(SVar1 & this->_numofslots - 1);
      ::SQObjectPtr::~SQObjectPtr(local_68);
    }
    local_38 = Add(this,(SQHash)*prev_local,(SQObject *)mainpos_local);
  }
  return local_38;
}

Assistant:

RefTable::RefNode *RefTable::Get(SQObject &obj,SQHash &mainpos,RefNode **prev,bool add)
{
    RefNode *ref;
    mainpos = ::HashObj(obj)&(_numofslots-1);
    *prev = NULL;
    for (ref = _buckets[mainpos]; ref; ) {
        if(_rawval(ref->obj) == _rawval(obj) && type(ref->obj) == type(obj))
            break;
        *prev = ref;
        ref = ref->next;
    }
    if(ref == NULL && add) {
        if(_numofslots == _slotused) {
            assert(_freelist == 0);
            Resize(_numofslots*2);
            mainpos = ::HashObj(obj)&(_numofslots-1);
        }
        ref = Add(mainpos,obj);
    }
    return ref;
}